

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O0

int mod2sparse_decomp_osd(mod2sparse *A,int R,mod2sparse *L,mod2sparse *U,int *rows,int *cols)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mod2entry *pmVar4;
  uint uVar5;
  void *__ptr;
  void *__ptr_00;
  mod2sparse *pmVar6;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  long in_R8;
  long in_R9;
  int nnf;
  int found;
  int pr;
  int cr2;
  int cc3;
  int cc2;
  int cc;
  int k;
  int j;
  int i;
  mod2entry *e2;
  mod2entry *fn;
  mod2entry *f;
  mod2entry *e;
  int N;
  int M;
  mod2sparse *B;
  int *rcnt;
  int *acnt;
  int *cinv;
  int *rinv;
  mod2sparse_strategy strategy;
  int abandon_when;
  int abandon_number;
  mod2entry *in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  bool bVar7;
  undefined4 in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int local_98;
  int iVar8;
  uint row1;
  mod2sparse *in_stack_ffffffffffffff70;
  mod2entry *local_80;
  mod2entry *local_78;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  if ((((in_RDX[1] != in_ESI) || (*in_RDX != iVar1)) || (in_RCX[1] != iVar2)) || (*in_RCX != in_ESI)
     ) {
    fprintf(_stderr,"mod2sparse_decomp: Matrices have incompatible dimensions\n");
    exit(1);
  }
  if (iVar2 - in_ESI < 0) {
    fprintf(_stderr,"Trying to abandon more columns than allowed\n");
    exit(1);
  }
  __ptr = chk_alloc(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
  __ptr_00 = chk_alloc(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
  mod2sparse_clear((mod2sparse *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  mod2sparse_clear((mod2sparse *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  pmVar6 = mod2sparse_allocate(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
  mod2sparse_copy((mod2sparse *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  (mod2sparse *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  for (iVar8 = 0; iVar8 < iVar1; iVar8 = iVar8 + 1) {
    *(int *)((long)__ptr + (long)iVar8 * 4) = iVar8;
    *(int *)(in_R8 + (long)iVar8 * 4) = iVar8;
  }
  for (local_98 = 0; local_98 < iVar2; local_98 = local_98 + 1) {
    *(int *)((long)__ptr_00 + (long)*(int *)(in_R9 + (long)local_98 * 4) * 4) = local_98;
  }
  iVar8 = 0;
  row1 = 0;
  do {
    if (in_ESI <= (int)row1) {
      for (; in_ESI < iVar1; in_ESI = in_ESI + 1) {
        while (-1 < **(int **)(*(long *)(in_RDX + 2) +
                               (long)*(int *)(in_R8 + (long)in_ESI * 4) * 0x38 + 0x10)) {
          mod2sparse_delete((mod2sparse *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff38);
        }
      }
      mod2sparse_free((mod2sparse *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      free(__ptr);
      free(__ptr_00);
      return iVar8;
    }
    bVar7 = false;
    for (uVar5 = row1; (int)uVar5 < iVar2; uVar5 = uVar5 + 1) {
      for (local_78 = pmVar6->cols[*(int *)(in_R9 + (long)(int)uVar5 * 4)].down; -1 < local_78->row;
          local_78 = local_78->down) {
        if ((int)row1 <= *(int *)((long)__ptr + (long)local_78->row * 4)) {
          bVar7 = true;
          goto LAB_0016e866;
        }
      }
    }
LAB_0016e866:
    in_stack_ffffffffffffff44 = 0;
    if (bVar7) {
      if (*(uint *)((long)__ptr_00 + (long)local_78->col * 4) != uVar5) {
        printf("\n e: %i, k: %i",(ulong)(uint)local_78->col,(ulong)uVar5);
        printf("\nError. Exiting.");
        exit(1);
      }
      *(undefined4 *)(in_R9 + (long)(int)uVar5 * 4) = *(undefined4 *)(in_R9 + (long)(int)row1 * 4);
      *(int *)(in_R9 + (long)(int)row1 * 4) = local_78->col;
      *(uint *)((long)__ptr_00 + (long)*(int *)(in_R9 + (long)(int)uVar5 * 4) * 4) = uVar5;
      *(uint *)((long)__ptr_00 + (long)*(int *)(in_R9 + (long)(int)row1 * 4) * 4) = row1;
      iVar3 = *(int *)((long)__ptr + (long)local_78->row * 4);
      if (iVar3 < (int)row1) {
        abort();
      }
      *(undefined4 *)(in_R8 + (long)iVar3 * 4) = *(undefined4 *)(in_R8 + (long)(int)row1 * 4);
      *(int *)(in_R8 + (long)(int)row1 * 4) = local_78->row;
      *(int *)((long)__ptr + (long)*(int *)(in_R8 + (long)iVar3 * 4) * 4) = iVar3;
      *(uint *)((long)__ptr + (long)*(int *)(in_R8 + (long)(int)row1 * 4) * 4) = row1;
    }
    else {
      iVar8 = iVar8 + 1;
    }
    local_80 = pmVar6->cols[*(int *)(in_R9 + (long)(int)row1 * 4)].down;
    while (-1 < local_80->row) {
      pmVar4 = local_80->down;
      iVar3 = local_80->row;
      local_80 = pmVar4;
      if ((int)row1 < *(int *)((long)__ptr + (long)iVar3 * 4)) {
        mod2sparse_add_row(in_stack_ffffffffffffff70,row1,
                           (mod2sparse *)CONCAT44(iVar3,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c);
        mod2sparse_insert((mod2sparse *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      }
      else if (*(int *)((long)__ptr + (long)iVar3 * 4) < (int)row1) {
        mod2sparse_insert((mod2sparse *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      }
      else {
        mod2sparse_insert((mod2sparse *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
        mod2sparse_insert((mod2sparse *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      }
    }
    while (-1 < (pmVar6->cols[*(int *)(in_R9 + (long)(int)row1 * 4)].down)->row) {
      mod2sparse_delete((mod2sparse *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        in_stack_ffffffffffffff38);
    }
    row1 = row1 + 1;
  } while( true );
}

Assistant:

int mod2sparse_decomp_osd
        ( mod2sparse *A,	/* Input matrix, M by N */
          int R,		/* Size of sub-matrix to find LU decomposition of */
          mod2sparse *L,	/* Matrix in which L is stored, M by R */
          mod2sparse *U,	/* Matrix in which U is stored, R by N */
          int *rows,		/* Array where row indexes are stored, M long */
          int *cols		/* Array where column indexes are stored, N long */
        )
{

    int abandon_number=0;  	/* Number of columns to abandon at some point *//* When to abandon these columns */
    int abandon_when=0;
    mod2sparse_strategy strategy =Mod2sparse_first;/* Strategy to follow in picking rows/columns */

    int *rinv, *cinv, *acnt, *rcnt;
    mod2sparse *B;
    int M, N;

    mod2entry *e, *f, *fn, *e2;
    int i, j, k, cc, cc2, cc3, cr2, pr;
    int found, nnf;

    M = mod2sparse_rows(A);
    N = mod2sparse_cols(A);

    if (mod2sparse_cols(L)!=R || mod2sparse_rows(L)!=M
        || mod2sparse_cols(U)!=N || mod2sparse_rows(U)!=R)
    { fprintf (stderr,
               "mod2sparse_decomp: Matrices have incompatible dimensions\n");
        exit(1);
    }

    if (abandon_number>N-R)
    { fprintf(stderr,"Trying to abandon more columns than allowed\n");
        exit(1);
    }

    rinv = chk_alloc (M, sizeof *rinv);
    cinv = chk_alloc (N, sizeof *cinv);

    if (abandon_number>0)
    { acnt = chk_alloc (M+1, sizeof *acnt);
    }

    if (strategy==Mod2sparse_minprod)
    { rcnt = chk_alloc (M, sizeof *rcnt);
    }


    //these are the problematic functions!
    mod2sparse_clear(L);
    mod2sparse_clear(U);

    /* Copy A to B.  B will be modified, then discarded. */

    B = mod2sparse_allocate(M,N);
    mod2sparse_copy(A,B);

    /* Count 1s in rows of B, if using minprod strategy. */

    if (strategy==Mod2sparse_minprod)
    { for (i = 0; i<M; i++)
        { rcnt[i] = mod2sparse_count_row(B,i);
        }
    }

    /* Set up initial row and column choices. */

    for (i = 0; i<M; i++) rows[i] = rinv[i] = i;
    for (j = 0; j<N; j++) {

        cinv[cols[j]]=j;

    }
    /* Find L and U one column at a time. */

    nnf = 0;

    for (i = 0; i<R; i++)
    {
        /* Choose the next row and column of B. */

        switch (strategy)
        {
            case Mod2sparse_first:
            {
                found = 0;

                for (k = i; k<N; k++)
                { e = mod2sparse_first_in_col(B,cols[k]);
                    while (!mod2sparse_at_end(e))
                    { if (rinv[mod2sparse_row(e)]>=i)
                        { found = 1;
                            goto out_first;
                        }
                        e = mod2sparse_next_in_col(e);
                    }
                }

                out_first:
                break;
            }

            case Mod2sparse_mincol:
            {
                found = 0;

                for (j = i; j<N; j++)
                { cc2 = mod2sparse_count_col(B,cols[j]);
                    if (!found || cc2<cc)
                    { e2 = mod2sparse_first_in_col(B,cols[j]);
                        while (!mod2sparse_at_end(e2))
                        { if (rinv[mod2sparse_row(e2)]>=i)
                            { found = 1;
                                cc = cc2;
                                e = e2;
                                k = j;
                                break;
                            }
                            e2 = mod2sparse_next_in_col(e2);
                        }
                    }
                }

                break;
            }

            case Mod2sparse_minprod:
            {
                found = 0;

                for (j = i; j<N; j++)
                { cc2 = mod2sparse_count_col(B,cols[j]);
                    e2 = mod2sparse_first_in_col(B,cols[j]);
                    while (!mod2sparse_at_end(e2))
                    { if (rinv[mod2sparse_row(e2)]>=i)
                        { cr2 = rcnt[mod2sparse_row(e2)];
                            if (!found || cc2==1 || (cc2-1)*(cr2-1)<pr)
                            { found = 1;
                                pr = cc2==1 ? 0 : (cc2-1)*(cr2-1);
                                e = e2;
                                k = j;
                            }
                        }
                        e2 = mod2sparse_next_in_col(e2);
                    }
                }

                break;
            }

            default:
            { fprintf(stderr,"mod2sparse_decomp: Unknown stategy\n");
                exit(1);
            }
        }

        if (!found)
        { nnf += 1;
        }



        /* Update 'rows' and 'cols'.  Looks at 'k' and 'e' found above. */

        if (found)
        {
            // if (cinv[mod2sparse_col(e)]!=k) abort();
            if (cinv[mod2sparse_col(e)]!=k){
                printf("\n e: %i, k: %i",mod2sparse_col(e),k);
                printf("\nError. Exiting.");
                exit(1);
            }


            cols[k] = cols[i];
            cols[i] = mod2sparse_col(e);

            cinv[cols[k]] = k;
            cinv[cols[i]] = i;

            k = rinv[mod2sparse_row(e)];

            if (k<i) abort();

            rows[k] = rows[i];
            rows[i] = mod2sparse_row(e);

            rinv[rows[k]] = k;
            rinv[rows[i]] = i;
        }



        /* Update L, U, and B. */

        f = mod2sparse_first_in_col(B,cols[i]);

        while (!mod2sparse_at_end(f))
        {
            fn = mod2sparse_next_in_col(f);
            k = mod2sparse_row(f);
            if (rinv[k]>i)
            { mod2sparse_add_row(B,k,B,mod2sparse_row(e));
                if (strategy==Mod2sparse_minprod)
                { rcnt[k] = mod2sparse_count_row(B,k);
                }
                mod2sparse_insert(L,k,i);
            }
            else if (rinv[k]<i)
            { mod2sparse_insert(U,rinv[k],cols[i]);
            }
            else
            { mod2sparse_insert(L,k,i);
                mod2sparse_insert(U,i,cols[i]);
            }

            f = fn;
        }


        /* Get rid of all entries in the current column of B, just to save space. */

        for (;;)
        { f = mod2sparse_first_in_col(B,cols[i]);
            if (mod2sparse_at_end(f)) break;
            mod2sparse_delete(B,f);
        }

        /* Abandon columns of B with lots of entries if it's time for that. */

        if (abandon_number>0 && i==abandon_when)
        {
            for (k = 0; k<M+1; k++)
            { acnt[k] = 0;
            }
            for (j = 0; j<N; j++)
            { k = mod2sparse_count_col(B,j);
                acnt[k] += 1;
            }

            cc = abandon_number;
            k = M;
            while (acnt[k]<cc)
            { cc -= acnt[k];
                k -= 1;
                if (k<0) abort();
            }

            cc2 = 0;
            for (j = 0; j<N; j++)
            { cc3 = mod2sparse_count_col(B,j);
                if (cc3>k || cc3==k && cc>0)
                { if (cc3==k) cc -= 1;
                    for (;;)
                    { f = mod2sparse_first_in_col(B,j);
                        if (mod2sparse_at_end(f)) break;
                        mod2sparse_delete(B,f);
                    }
                    cc2 += 1;
                }
            }

            if (cc2!=abandon_number) abort();

            if (strategy==Mod2sparse_minprod)
            { for (j = 0; j<M; j++)
                { rcnt[j] = mod2sparse_count_row(B,j);
                }
            }
        }
    }

    /* Get rid of all entries in the rows of L past row R, after reordering. */

    for (i = R; i<M; i++)
    { for (;;)
        { f = mod2sparse_first_in_row(L,rows[i]);
            if (mod2sparse_at_end(f)) break;
            mod2sparse_delete(L,f);
        }
    }

    mod2sparse_free(B);
    free(rinv);
    free(cinv);
    if (strategy==Mod2sparse_minprod) free(rcnt);
    if (abandon_number>0) free(acnt);

    return nnf;
}